

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_mapper_posix.hpp
# Opt level: O0

void __thiscall tao::pegtl::internal::file_mapper::file_mapper(file_mapper *this,char *filename)

{
  file_opener local_28;
  char *local_18;
  char *filename_local;
  file_mapper *this_local;
  
  local_18 = filename;
  filename_local = (char *)this;
  file_opener::file_opener(&local_28,filename);
  file_mapper(this,&local_28);
  file_opener::~file_opener(&local_28);
  return;
}

Assistant:

explicit file_mapper( const char* filename )
               : file_mapper( file_opener( filename ) )
            {
            }